

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O0

void __thiscall xray_re::_lzhuf::Putcode(_lzhuf *this,int l,uint c)

{
  byte bVar1;
  uint uVar2;
  FILE *__stream;
  uint c_local;
  int l_local;
  _lzhuf *this_local;
  
  this->putbuf = c >> (this->putlen & 0x1f) | this->putbuf;
  uVar2 = (uint)this->putlen + l;
  this->putlen = (uchar)uVar2;
  if (7 < (uVar2 & 0xff)) {
    putc(this,this->putbuf >> 8,(FILE *)(ulong)(uint)l);
    bVar1 = this->putlen - 8;
    this->putlen = bVar1;
    if (bVar1 < 8) {
      this->putbuf = this->putbuf << 8;
      this->codesize = this->codesize + 1;
    }
    else {
      putc(this,this->putbuf,__stream);
      this->codesize = this->codesize + 2;
      this->putlen = this->putlen + 0xf8;
      this->putbuf = c << ((char)l - this->putlen & 0x1f);
    }
  }
  return;
}

Assistant:

void _lzhuf::Putcode(int l, unsigned c)		/* output c bits of code */
{
	putbuf |= c >> putlen;
	if ((putlen += l) >= 8) {
		putc(putbuf >> 8);
		if ((putlen -= 8) >= 8) {
			putc(putbuf);
			codesize += 2;
			putlen -= 8;
			putbuf = c << (l - putlen);
		} else {
			putbuf <<= 8;
			codesize++;
		}
	}
}